

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.cpp
# Opt level: O1

bool __thiscall xmrig::OclThread::isEqual(OclThread *this,OclThread *other)

{
  pointer __s2;
  pointer __s1;
  pointer plVar1;
  int iVar2;
  size_t __n;
  
  __s2 = (other->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
  __s1 = (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
  plVar1 = (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)plVar1 - (long)__s1;
  if ((((long)(other->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__s2 == __n) &&
      ((((plVar1 == __s1 || (iVar2 = bcmp(__s1,__s2,__n), iVar2 == 0)) &&
        (other->m_bfactor == this->m_bfactor)) &&
       ((other->m_datasetHost == this->m_datasetHost && (other->m_gcnAsm == this->m_gcnAsm)))))) &&
     ((other->m_index == this->m_index &&
      (((other->m_intensity == this->m_intensity && (other->m_memChunk == this->m_memChunk)) &&
       ((other->m_stridedIndex == this->m_stridedIndex &&
        (other->m_unrollFactor == this->m_unrollFactor)))))))) {
    return other->m_worksize == this->m_worksize;
  }
  return false;
}

Assistant:

bool xmrig::OclThread::isEqual(const OclThread &other) const
{
    return other.m_threads.size() == m_threads.size() &&
           std::equal(m_threads.begin(), m_threads.end(), other.m_threads.begin()) &&
           other.m_bfactor      == m_bfactor &&
           other.m_datasetHost  == m_datasetHost &&
           other.m_gcnAsm       == m_gcnAsm &&
           other.m_index        == m_index &&
           other.m_intensity    == m_intensity &&
           other.m_memChunk     == m_memChunk &&
           other.m_stridedIndex == m_stridedIndex &&
           other.m_unrollFactor == m_unrollFactor &&
           other.m_worksize     == m_worksize;
}